

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_DCData.cpp
# Opt level: O3

h__Reader * __thiscall
ASDCP::DCData::MXFReader::h__Reader::ReadFrame
          (h__Reader *this,ui32_t FrameNum,FrameBuffer *FrameBuf,AESDecContext *Ctx,
          HMACContext *HMAC)

{
  char cVar1;
  MDDEntry *Ctx_00;
  MDD_t type_id;
  undefined4 in_register_00000034;
  long lVar2;
  
  lVar2 = CONCAT44(in_register_00000034,FrameNum);
  cVar1 = (**(code **)(**(long **)(lVar2 + 0x10) + 0x40))();
  if (cVar1 == '\0') {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  }
  else {
    if (*(Dictionary **)(lVar2 + 8) == (Dictionary *)0x0) {
      __assert_fail("m_Dict",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_DCData.cpp"
                    ,0xc5,
                    "ASDCP::Result_t ASDCP::DCData::MXFReader::h__Reader::ReadFrame(ui32_t, FrameBuffer &, AESDecContext *, HMACContext *)"
                   );
    }
    if (*(char *)(lVar2 + 0x658) == '\x01') {
      type_id = MDD_PrivateDCDataEssence;
    }
    else {
      type_id = MDD_DCDataEssence;
    }
    Ctx_00 = Dictionary::Type(*(Dictionary **)(lVar2 + 8),type_id);
    h__ASDCPReader::ReadEKLVFrame
              (&this->super_h__ASDCPReader,FrameNum,(FrameBuffer *)((ulong)FrameBuf & 0xffffffff),
               (byte_t *)Ctx,(AESDecContext *)Ctx_00,HMAC);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::DCData::MXFReader::h__Reader::ReadFrame(ui32_t FrameNum, FrameBuffer& FrameBuf,
		      AESDecContext* Ctx, HMACContext* HMAC)
{
  if ( ! m_File->IsOpen() )
    return RESULT_INIT;

  assert(m_Dict);
  if ( m_PrivateLabelCompatibilityMode )
    {
      return ReadEKLVFrame(FrameNum, FrameBuf, m_Dict->ul(MDD_PrivateDCDataEssence), Ctx, HMAC);
    }

  return ReadEKLVFrame(FrameNum, FrameBuf, m_Dict->ul(MDD_DCDataEssence), Ctx, HMAC);
}